

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O3

bool __thiscall
banksia::TourMng::pairingMatchList
          (TourMng *this,
          vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *playerVec,int round)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *name0;
  pointer pcVar2;
  pointer pMVar3;
  size_type sVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *pvVar8;
  uint uVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  MatchRecord *r;
  long *plVar13;
  undefined8 *puVar14;
  pointer pMVar15;
  uint uVar16;
  ulong uVar17;
  ulong *puVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_type *psVar20;
  undefined4 in_register_00000014;
  ulong uVar21;
  int *piVar22;
  pointer pTVar23;
  int iVar24;
  char cVar25;
  undefined8 uVar26;
  uint uVar27;
  uint uVar28;
  pointer pTVar29;
  __normal_iterator<banksia::TourPlayer_*,_std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>_>
  __i;
  pointer pTVar30;
  uint uVar31;
  TourMng *pTVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_2;
  string __str_2;
  string __str;
  string str;
  string __str_4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairedSet;
  string local_1f8;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  ulong *local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  ulong local_1a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  TourMng *local_178;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *local_170;
  undefined8 local_168;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [6];
  ResultType local_68;
  int local_3c;
  int local_38;
  
  local_168 = CONCAT44(in_register_00000014,round);
  pTVar29 = (playerVec->
            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pTVar23 = (playerVec->
            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar17 = ((long)pTVar23 - (long)pTVar29 >> 4) * -0x3333333333333333;
  if (uVar17 < 2) {
    if ((long)pTVar23 - (long)pTVar29 == 0x50) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     "\n* The winner is ",&pTVar29->name);
      matchLog(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
               true);
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_);
      }
    }
    return false;
  }
  local_170 = playerVec;
  if ((uVar17 & 1) != 0) {
    iVar24 = 10;
    do {
      iVar12 = rand();
      pTVar29 = (playerVec->
                super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar23 = (playerVec->
                super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      uVar17 = ((long)pTVar23 - (long)pTVar29 >> 4) * -0x3333333333333333;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar17;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)iVar12;
      uVar21 = SUB168(auVar7 % auVar6,0);
      if (pTVar29[uVar21].byeCnt == 0) {
        if (-1 < SUB164(auVar7 % auVar6,0)) goto LAB_0015e021;
        break;
      }
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
    if (pTVar23 != pTVar29) {
      piVar22 = &pTVar29->byeCnt;
      uVar21 = 0;
      do {
        if (*piVar22 == 0) goto LAB_0015e021;
        uVar21 = uVar21 + 1;
        piVar22 = piVar22 + 0x14;
      } while (uVar17 + (uVar17 == 0) != uVar21);
    }
    iVar24 = rand();
    uVar21 = (ulong)(long)iVar24 %
             (ulong)(((long)(playerVec->
                            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(playerVec->
                            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Warning: all players have been bye (odd players who got free wins).",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    pTVar29 = (playerVec->
              super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar17 = ((long)(playerVec->
                    super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar29 >> 4) *
             -0x3333333333333333;
LAB_0015e021:
    uVar21 = (ulong)(int)uVar21;
    if (uVar17 <= uVar21) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar21,
                 uVar17);
    }
    name0 = (string *)(local_160 + 8);
    local_160._0_8_ = &PTR__TourPlayer_001c0228;
    local_160._8_8_ = local_150._M_local_buf + 8;
    pcVar2 = pTVar29[uVar21].name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)name0,pcVar2,pcVar2 + pTVar29[uVar21].name._M_string_length);
    local_118 = pTVar29[uVar21].whiteCnt;
    pTVar23 = pTVar29 + uVar21;
    local_138._0_4_ = pTVar23->gameCnt;
    local_138._4_4_ = pTVar23->winCnt;
    uStack_130 = *(undefined8 *)(&pTVar23->gameCnt + 2);
    pTVar29 = pTVar29 + uVar21;
    local_128._0_4_ = pTVar29->abnormalCnt;
    local_128._4_4_ = pTVar29->elo;
    uStack_120 = *(undefined8 *)(&pTVar29->abnormalCnt + 2);
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::_M_erase
              (playerVec,
               (playerVec->
               super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
               _M_impl.super__Vector_impl_data._M_start + uVar21);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
    uVar26 = local_168;
    MatchRecord::MatchRecord((MatchRecord *)local_f0,name0,&local_1f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    local_f0._8_4_ = 2;
    local_68 = win;
    local_3c = (int)uVar26;
    local_38 = rand();
    addMatchRecord_simple(this,(MatchRecord *)local_f0);
    std::operator+(&local_198,"\n* Player ",name0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_198);
    puVar18 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar18) {
      local_1c8 = *puVar18;
      lStack_1c0 = plVar13[3];
      local_1d8 = &local_1c8;
    }
    else {
      local_1c8 = *puVar18;
      local_1d8 = (ulong *)*plVar13;
    }
    local_1d0 = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar31 = (int)uVar26 + 1;
    uVar28 = -uVar31;
    if (0 < (int)uVar31) {
      uVar28 = uVar31;
    }
    uVar27 = 1;
    if (9 < uVar28) {
      uVar17 = (ulong)uVar28;
      uVar9 = 4;
      do {
        uVar27 = uVar9;
        uVar16 = (uint)uVar17;
        if (uVar16 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_0015e1e8;
        }
        if (uVar16 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_0015e1e8;
        }
        if (uVar16 < 10000) goto LAB_0015e1e8;
        uVar17 = uVar17 / 10000;
        uVar9 = uVar27 + 4;
      } while (99999 < uVar16);
      uVar27 = uVar27 + 1;
    }
LAB_0015e1e8:
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar27 - (char)((int)uVar31 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_1b8 + (ulong)(uVar31 >> 0x1f)),uVar27,uVar28);
    uVar17 = CONCAT44(uStack_1ac,local_1b0) + local_1d0;
    uVar21 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar21 = local_1c8;
    }
    if (uVar21 < uVar17) {
      uVar21 = 0xf;
      if (local_1b8 != local_1a8) {
        uVar21 = local_1a8[0];
      }
      if (uVar21 < uVar17) goto LAB_0015e262;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1d8);
    }
    else {
LAB_0015e262:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8);
    }
    psVar20 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_1f8.field_2._M_allocated_capacity = *psVar20;
      local_1f8.field_2._8_8_ = puVar14[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar20;
      local_1f8._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_1f8._M_string_length = puVar14[1];
    *puVar14 = psVar20;
    puVar14[1] = 0;
    *(undefined1 *)psVar20 = 0;
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    pvVar8 = local_170;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    matchLog(this,&local_1f8,(bool)banksiaVerbose);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    MatchRecord::~MatchRecord((MatchRecord *)local_f0);
    local_160._0_8_ = &PTR__TourPlayer_001c0228;
    if ((char *)local_160._8_8_ != local_150._M_local_buf + 8) {
      operator_delete((void *)local_160._8_8_);
    }
    pTVar29 = (pvVar8->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar23 = (pvVar8->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pTVar29 != pTVar23) {
    uVar17 = ((long)pTVar23 - (long)pTVar29 >> 4) * -0x3333333333333333;
    lVar5 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
              (pTVar29,pTVar23,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar23 - (long)pTVar29 < 0x501) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                (pTVar29,pTVar23);
    }
    else {
      pTVar30 = pTVar29 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                (pTVar29,pTVar30);
      for (; pTVar30 != pTVar23; pTVar30 = pTVar30 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Val_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                  (pTVar30);
      }
    }
  }
  local_f0._24_8_ = local_f0 + 8;
  local_f0._8_4_ = _S_red;
  local_f0._16_8_ = 0;
  local_d0[0]._8_8_ = 0;
  pMVar15 = (this->matchRecordList).
            super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar3 = (this->matchRecordList).
           super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_178 = this;
  local_d0[0]._0_8_ = local_f0._24_8_;
  if (pMVar15 != pMVar3) {
    do {
      sVar4 = pMVar15->playernames[0]._M_string_length;
      if ((sVar4 != 0) && (pMVar15->playernames[1]._M_string_length != 0)) {
        pcVar2 = pMVar15->playernames[0]._M_dataplus._M_p;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_1f8,pcVar2,pcVar2 + sVar4);
        std::__cxx11::string::append((char *)&local_1f8);
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1f8,(ulong)pMVar15->playernames[1]._M_dataplus._M_p);
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 == paVar19) {
          local_150._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_150._8_8_ = puVar14[3];
          local_160._0_8_ = &local_150;
        }
        else {
          local_150._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_160._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar14;
        }
        local_160._8_8_ = puVar14[1];
        *puVar14 = paVar19;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._0_8_ != &local_150) {
          operator_delete((void *)local_160._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
      }
      pMVar15 = pMVar15 + 1;
    } while (pMVar15 != pMVar3);
  }
  pvVar8 = local_170;
  pTVar32 = local_178;
  iVar24 = (int)local_168;
  bVar11 = pairingMatchListRecusive
                     (local_178,local_170,iVar24,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_f0);
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: All players have played together already.",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f0);
    bVar11 = pairingMatchListRecusive
                       (pTVar32,pvVar8,iVar24,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_f0);
    if (!bVar11) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: cannot pair players.",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      bVar11 = false;
      goto LAB_0015ece8;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_198,tourTypeNames[(int)pTVar32->type],(allocator *)&local_110);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x18679b);
  puVar18 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar18) {
    local_1c8 = *puVar18;
    lStack_1c0 = plVar13[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar18;
    local_1d8 = (ulong *)*plVar13;
  }
  local_1d0 = plVar13[1];
  *plVar13 = (long)puVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  paVar19 = &local_1f8.field_2;
  puVar18 = (ulong *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_1f8.field_2._M_allocated_capacity = *puVar18;
    local_1f8.field_2._8_8_ = plVar13[3];
    local_1f8._M_dataplus._M_p = (pointer)paVar19;
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *puVar18;
    local_1f8._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_1f8._M_string_length = plVar13[1];
  *plVar13 = (long)puVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  uVar31 = iVar24 + 1;
  uVar28 = -uVar31;
  if (0 < (int)uVar31) {
    uVar28 = uVar31;
  }
  uVar27 = 1;
  if (9 < uVar28) {
    uVar17 = (ulong)uVar28;
    uVar9 = 4;
    do {
      uVar27 = uVar9;
      uVar16 = (uint)uVar17;
      if (uVar16 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_0015e720;
      }
      if (uVar16 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_0015e720;
      }
      if (uVar16 < 10000) goto LAB_0015e720;
      uVar17 = uVar17 / 10000;
      uVar9 = uVar27 + 4;
    } while (99999 < uVar16);
    uVar27 = uVar27 + 1;
  }
LAB_0015e720:
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar27 - (char)((int)uVar31 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar31 >> 0x1f) + (long)local_1b8),uVar27,uVar28);
  uVar17 = CONCAT44(uStack_1ac,local_1b0) + local_1f8._M_string_length;
  uVar26 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar19) {
    uVar26 = local_1f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar26 < uVar17) {
    uVar21 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar21 = local_1a8[0];
    }
    if (uVar21 < uVar17) goto LAB_0015e79e;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1f8._M_dataplus._M_p);
  }
  else {
LAB_0015e79e:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1b8);
  }
  local_160._0_8_ = &local_150;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 == paVar1) {
    local_150._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_150._8_8_ = puVar14[3];
  }
  else {
    local_150._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_160._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar14;
  }
  local_160._8_8_ = puVar14[1];
  *puVar14 = paVar1;
  puVar14[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar19) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (pTVar32->type == swiss) {
    uVar28 = pTVar32->swissRounds;
    uVar31 = -uVar28;
    if (0 < (int)uVar28) {
      uVar31 = uVar28;
    }
    uVar27 = 1;
    if (9 < uVar31) {
      uVar17 = (ulong)uVar31;
      uVar9 = 4;
      do {
        uVar27 = uVar9;
        uVar16 = (uint)uVar17;
        if (uVar16 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_0015e8b9;
        }
        if (uVar16 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_0015e8b9;
        }
        if (uVar16 < 10000) goto LAB_0015e8b9;
        uVar17 = uVar17 / 10000;
        uVar9 = uVar27 + 4;
      } while (99999 < uVar16);
      uVar27 = uVar27 + 1;
    }
LAB_0015e8b9:
    local_1d8 = &local_1c8;
    std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar27 - (char)((int)uVar28 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar28 >> 0x1f) + (long)local_1d8),uVar27,uVar31);
    puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x187967);
    pTVar32 = local_178;
    puVar18 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_1f8.field_2._M_allocated_capacity = *puVar18;
      local_1f8.field_2._8_8_ = puVar14[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar19;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *puVar18;
      local_1f8._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_1f8._M_string_length = puVar14[1];
    *puVar14 = puVar18;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    std::__cxx11::string::_M_append(local_160,(ulong)local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar19) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
  }
  uVar17 = ((long)(local_170->
                  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_170->
                  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  uVar21 = uVar17 >> 1;
  cVar25 = '\x01';
  if (0x13 < uVar17) {
    uVar17 = uVar21;
    cVar10 = '\x04';
    do {
      cVar25 = cVar10;
      if (uVar17 < 100) {
        cVar25 = cVar25 + -2;
        goto LAB_0015ea08;
      }
      if (uVar17 < 1000) {
        cVar25 = cVar25 + -1;
        goto LAB_0015ea08;
      }
      if (uVar17 < 10000) goto LAB_0015ea08;
      bVar11 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar10 = cVar25 + '\x04';
    } while (bVar11);
    cVar25 = cVar25 + '\x01';
  }
LAB_0015ea08:
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,cVar25);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b8,local_1b0,uVar21);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x189f72);
  psVar20 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar20) {
    local_198.field_2._M_allocated_capacity = *psVar20;
    local_198.field_2._8_8_ = plVar13[3];
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar20;
    local_198._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_198._M_string_length = plVar13[1];
  *plVar13 = (long)psVar20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
  puVar18 = puVar14 + 2;
  if ((ulong *)*puVar14 == puVar18) {
    local_1c8 = *puVar18;
    lStack_1c0 = puVar14[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar18;
    local_1d8 = (ulong *)*puVar14;
  }
  local_1d0 = puVar14[1];
  *puVar14 = puVar18;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  uVar28 = 0;
  for (pMVar15 = (pTVar32->matchRecordList).
                 super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pMVar15 !=
      (pTVar32->matchRecordList).
      super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
      super__Vector_impl_data._M_finish; pMVar15 = pMVar15 + 1) {
    uVar28 = uVar28 + (pMVar15->state == none);
  }
  uVar31 = -uVar28;
  if (0 < (int)uVar28) {
    uVar31 = uVar28;
  }
  uVar27 = 1;
  if (9 < uVar31) {
    uVar17 = (ulong)uVar31;
    uVar9 = 4;
    do {
      uVar27 = uVar9;
      uVar16 = (uint)uVar17;
      if (uVar16 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_0015eb62;
      }
      if (uVar16 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_0015eb62;
      }
      if (uVar16 < 10000) goto LAB_0015eb62;
      uVar17 = uVar17 / 10000;
      uVar9 = uVar27 + 4;
    } while (99999 < uVar16);
    uVar27 = uVar27 + 1;
  }
LAB_0015eb62:
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar27 - (char)((int)uVar28 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar28 >> 0x1f) + (long)local_110),uVar27,uVar31);
  uVar17 = 0xf;
  if (local_1d8 != &local_1c8) {
    uVar17 = local_1c8;
  }
  if (uVar17 < (ulong)(local_108 + local_1d0)) {
    uVar17 = 0xf;
    if (local_110 != local_100) {
      uVar17 = local_100[0];
    }
    if (uVar17 < (ulong)(local_108 + local_1d0)) goto LAB_0015ebf0;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_0015ebf0:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_110);
  }
  psVar20 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar20) {
    local_1f8.field_2._M_allocated_capacity = *psVar20;
    local_1f8.field_2._8_8_ = puVar14[3];
    local_1f8._M_dataplus._M_p = (pointer)paVar19;
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar20;
    local_1f8._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_1f8._M_string_length = puVar14[1];
  *puVar14 = psVar20;
  puVar14[1] = 0;
  *(undefined1 *)psVar20 = 0;
  std::__cxx11::string::_M_append(local_160,(ulong)local_1f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar19) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  pTVar32 = local_178;
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  matchLog(pTVar32,(string *)local_160,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != &local_150) {
    operator_delete((void *)local_160._0_8_);
  }
  bVar11 = true;
LAB_0015ece8:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0);
  return bVar11;
}

Assistant:

bool TourMng::pairingMatchList(std::vector<TourPlayer> playerVec, int round)
{
    if (playerVec.size() < 2) {
        if (playerVec.size() == 1) {
            auto str = "\n* The winner is " + playerVec.front().name;
            matchLog(str, true);
        }
        return false;
    }
    
    // odd/bye players, one won't have opponent and he is lucky to set win
    if (playerVec.size() & 1) {
        auto luckyIdx = -1;
        for (int i = 0; i < 10; i++) {
            auto k = std::rand() % playerVec.size();
            if (playerVec.at(k).byeCnt == 0) {
                luckyIdx = int(k);
                break;
            }
        }
        
        if (luckyIdx < 0) {
            for (int i = 0; i <  playerVec.size(); i++) {
                if (playerVec.at(i).byeCnt == 0) {
                    luckyIdx = i;
                    break;
                }
            }
        }
        
        if (luckyIdx < 0) {
            luckyIdx = std::rand() % playerVec.size();
            std::cerr << "Warning: all players have been bye (odd players who got free wins)." << std::endl;
        }
        
        auto luckPlayer = playerVec.at(luckyIdx);
        
        {
            auto it = playerVec.begin();
            std::advance(it, luckyIdx);
            playerVec.erase(it);
        }
        
        
        // the odd player wins all games in the round
        MatchRecord record(luckPlayer.name, "", false);
        record.round = round;
        record.state = MatchState::completed;
        record.result.result = ResultType::win; // win
        record.pairId = std::rand();
        addMatchRecord_simple(record);
        
        auto str = "\n* Player " + luckPlayer.name + " is an odd one (no opponent to pair with) and receives a bye (a win) for round " + std::to_string(round + 1);
        matchLog(str, banksiaVerbose);
    }
    
    std::sort(playerVec.begin(), playerVec.end(), [](const TourPlayer& lhs, const TourPlayer& rhs)
              {
                  return lhs.getScore() > rhs.getScore();
              });
    
    std::set<std::string> pairedSet;
    for(auto && m : matchRecordList) {
        if (m.playernames[0].empty() || m.playernames[1].empty()) continue;
        pairedSet.insert(m.playernames[0] + "*" + m.playernames[1]);
    }
    
    if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
        std::cout << "Warning: All players have played together already." << std::endl;
        pairedSet.clear();
        if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
            std::cerr << "Error: cannot pair players." << std::endl;
            return false;
        }
    }
    
    std::string str = "\n" + std::string(tourTypeNames[static_cast<int>(type)]) + " round: " + std::to_string(round + 1);
    if (type == TourType::swiss) {
        str += "/" + std::to_string(swissRounds);
    }
    str += ", pairs: " + std::to_string(playerVec.size() / 2) + ", matches: " + std::to_string(uncompletedMatches());
    
    matchLog(str, true);
    return true;
}